

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<long>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                    *this,long value)

{
  int iVar1;
  type pwVar2;
  uint64_t n;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  iVar1 = internal::count_digits(n);
  pwVar2 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                     (&this->out_,(long)iVar1 - (value >> 0x3f));
  if (value < 0) {
    *pwVar2 = L'-';
    pwVar2 = pwVar2 + 1;
  }
  internal::format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::no_thousands_sep>
            (pwVar2,n,iVar1);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }